

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearDriveline::IntLoadConstraint_C
          (ChLinkMotorLinearDriveline *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Scalar *pSVar8;
  undefined3 in_register_00000009;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double local_48;
  double local_40;
  
  ChLinkMateGeneric::IntLoadConstraint_C
            ((ChLinkMateGeneric *)this,off_L,Qc,c,do_clamp,recovery_clamp);
  iVar1 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr;
  dVar12 = (double)(**(code **)(*(long *)&(this->super_ChLinkMotorLinear).super_ChLinkMotor.
                                          super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink.
                                          super_ChLinkBase.super_ChPhysicsItem + 600))(this);
  auVar11._8_8_ = in_XMM1_Qb;
  auVar11._0_8_ = recovery_clamp;
  local_40 = (dVar12 - *(double *)(*(long *)&(this->super_ChLinkMotorLinear).field_0x278 + 0x88)) *
             c;
  if (CONCAT31(in_register_00000009,do_clamp) != 0) {
    auVar10._8_8_ = 0x8000000000000000;
    auVar10._0_8_ = 0x8000000000000000;
    auVar10 = vxorpd_avx512vl(auVar11,auVar10);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_40;
    auVar10 = vmaxsd_avx(auVar15,auVar10);
    auVar11 = vminsd_avx(auVar10,auVar11);
    local_40 = auVar11._0_8_;
  }
  uVar9 = iVar1 + off_L;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,(ulong)uVar9)
  ;
  *pSVar8 = local_40 + *pSVar8;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       ((this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->pos;
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  auVar11 = vxorpd_avx512vl(auVar13,auVar2);
  local_40 = auVar11._0_8_ * c;
  if (do_clamp) {
    auVar6._8_8_ = in_XMM1_Qb;
    auVar6._0_8_ = recovery_clamp;
    auVar3._8_8_ = 0x8000000000000000;
    auVar3._0_8_ = 0x8000000000000000;
    auVar11 = vxorpd_avx512vl(auVar6,auVar3);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_40;
    auVar11 = vmaxsd_avx(auVar16,auVar11);
    auVar11 = vminsd_avx(auVar11,auVar6);
    local_40 = auVar11._0_8_;
  }
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                      (ulong)(uVar9 + 1));
  *pSVar8 = local_40 + *pSVar8;
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       ((this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->pos;
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar11 = vxorpd_avx512vl(auVar14,auVar4);
  local_48 = auVar11._0_8_ * c;
  if (do_clamp) {
    auVar7._8_8_ = in_XMM1_Qb;
    auVar7._0_8_ = recovery_clamp;
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar11 = vxorpd_avx512vl(auVar7,auVar5);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_48;
    auVar11 = vmaxsd_avx(auVar17,auVar11);
    auVar11 = vminsd_avx(auVar11,auVar7);
    local_48 = auVar11._0_8_;
  }
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                      (ulong)(uVar9 + 2));
  *pSVar8 = local_48 + *pSVar8;
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::IntLoadConstraint_C(const unsigned int off_L,
                                       ChVectorDynamic<>& Qc,
                                       const double c,
                                       bool do_clamp,
                                       double recovery_clamp) {
    // First, inherit to parent class
    ChLinkMotorLinear::IntLoadConstraint_C(off_L, Qc, c, do_clamp, recovery_clamp);

    int nc = mask.nconstr;

    // compute custom violation C:
    double cnstr_pos_error1 =  this->GetMotorPos() - (this->innershaft1lin->GetPos());// - this->innershaft2lin->GetPos());
    double cnstr_violation1 = c * cnstr_pos_error1;
    if (do_clamp)
        cnstr_violation1 = ChMin(ChMax(cnstr_violation1, -recovery_clamp), recovery_clamp);
    Qc(off_L + nc + 0) += cnstr_violation1;

    // Always drive inner linear shaft 2 to zero
    // (hack! this is not exact if also the guide, part 2, moves fast?)
    double cnstr_violation2 = c * -this->innershaft2lin->GetPos();
    if (do_clamp)
        cnstr_violation2 = ChMin(ChMax(cnstr_violation2, -recovery_clamp), recovery_clamp);
    Qc(off_L + nc + 1) += cnstr_violation2;

    // Always drive inner rotational shaft 2 to zero
    // (hack! this is not exact if also the guide, part 2, rotates fast?)
    double cnstr_violation2r = c * -innershaft2rot->GetPos();
    if (do_clamp)
        cnstr_violation2r = ChMin(ChMax(cnstr_violation2r, -recovery_clamp), recovery_clamp);
    Qc(off_L + nc + 2) += cnstr_violation2r;

}